

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbifnet.cpp
# Opt level: O2

vm_obj_id_t __thiscall
TadsHttpReqResult::prep_event_obj(TadsHttpReqResult *this,int *argc,int *evt_type)

{
  char cVar1;
  byte bVar2;
  vm_globalvar_t *pvVar3;
  anon_union_8_8_cb74652f_for_val aVar4;
  vm_datatype_t *pvVar5;
  undefined4 uVar6;
  vm_val_t *pvVar7;
  int iVar8;
  int iVar9;
  vm_obj_id_t vVar10;
  size_t sVar11;
  char *pcVar12;
  char *charset_name;
  size_t charset_name_len;
  
  pcVar12 = this->loc;
  if (pcVar12 == (char *)0x0) {
    sVar11 = 0;
  }
  else {
    sVar11 = strlen(pcVar12);
  }
  CVmRun::push_string(&G_interpreter_X,pcVar12,sVar11);
  pcVar12 = this->hdrs;
  if (pcVar12 == (char *)0x0) {
    sVar11 = 0;
  }
  else {
    sVar11 = strlen(pcVar12);
  }
  CVmRun::push_string(&G_interpreter_X,pcVar12,sVar11);
  if (this->reply == (CVmDataSource *)0x0) {
    pvVar5 = &sp_->typ;
    sp_ = sp_ + 1;
    *pvVar5 = VM_NIL;
  }
  else {
    pcVar12 = find_header(this,"content-type");
    iVar9 = 3;
    vVar10 = 0;
    if ((pcVar12 != (char *)0x0) && (iVar8 = bcmp(pcVar12,"text/",5), vVar10 = 0, iVar8 == 0)) {
      do {
        for (; cVar1 = *pcVar12, cVar1 != ';'; pcVar12 = pcVar12 + 1) {
          if (((cVar1 == '\0') || (cVar1 == '\n')) || (cVar1 == '\r')) {
            charset_name_len = 10;
            charset_name = "ISO-8859-1";
            goto LAB_002042a0;
          }
        }
        pcVar12 = pcVar12 + 9;
        do {
          charset_name = pcVar12;
          if (charset_name[-8] == L'\0') break;
          iVar9 = is_space((int)charset_name[-8]);
          pcVar12 = charset_name + 1;
        } while (iVar9 != 0);
        pcVar12 = charset_name + -8;
      } while (*(long *)(charset_name + -8) != 0x3d74657372616863);
      charset_name_len = 0;
      while( true ) {
        bVar2 = charset_name[charset_name_len];
        if ((((ulong)bVar2 < 0x3c) && ((0x800000000002400U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) ||
           (iVar9 = is_space((int)(char)bVar2), iVar9 != 0)) break;
        charset_name_len = charset_name_len + 1;
      }
LAB_002042a0:
      vVar10 = CVmObjCharSet::create(0,charset_name,charset_name_len);
      iVar9 = 1;
    }
    (*this->reply->_vptr_CVmDataSource[8])(this->reply,0,0);
    vVar10 = CVmObjFile::create(0,(CVmNetFile *)0x0,vVar10,this->reply,iVar9,1,1);
    pvVar7 = sp_;
    pvVar5 = &sp_->typ;
    sp_ = sp_ + 1;
    *pvVar5 = VM_OBJ;
    (pvVar7->val).obj = vVar10;
    this->reply = (CVmDataSource *)0x0;
  }
  pvVar7 = sp_;
  vVar10 = this->status;
  pvVar5 = &sp_->typ;
  sp_ = sp_ + 1;
  *pvVar5 = VM_INT;
  (pvVar7->val).obj = vVar10;
  pvVar7 = sp_;
  pvVar3 = this->idg;
  uVar6 = *(undefined4 *)&(pvVar3->val).field_0x4;
  aVar4 = (pvVar3->val).val;
  sp_ = sp_ + 1;
  pvVar7->typ = (pvVar3->val).typ;
  *(undefined4 *)&pvVar7->field_0x4 = uVar6;
  pvVar7->val = aVar4;
  *argc = 5;
  *evt_type = 5;
  return G_predef_X.net_reply_event;
}

Assistant:

virtual vm_obj_id_t prep_event_obj(VMG_ int *argc, int *evt_type)
    {
        /* push the location string (or nil) */
        G_interpreter->push_string(vmg_ loc, loc != 0 ? strlen(loc) : 0);

        /* push the header string (or nil) */
        G_interpreter->push_string(vmg_ hdrs, hdrs != 0 ? strlen(hdrs) : 0);

        /* if we have reply data, push it as a File object */
        if (reply != 0)
        {
            /*
             *   Look for a content-type header, to determine the format of
             *   the reply body.  If the header starts with "text/", it's a
             *   text type; otherwise it's a binary type.
             */
            int mode = VMOBJFILE_MODE_RAW;
            const char *charset = "ISO-8859-1";
            size_t cslen = 10;
            const char *ct = find_header("content-type");
            if (ct != 0 && memcmp(ct, "text/", 5) == 0)
            {
                /* it's a textual type */
                mode = VMOBJFILE_MODE_TEXT;

                /* look for a 'charset' attribute */
                for (;;)
                {
                    /* scan ahead to the next ';' before end of line */
                    for ( ; *ct != '\0' && *ct != '\r'
                            && *ct != '\n' && *ct != ';' ; ++ct) ;
                    if (*ct != ';')
                        break;

                    /* skip the ';' and spaces */
                    for (ct += 1 ; *ct != '\0' && is_space(*ct) ; ++ct) ;

                    /* check for "charset" */
                    if (memcmp(ct, "charset=", 8) == 0)
                    {
                        /* note the "charset" attribute, and find the end */
                        for (ct += 8, charset = ct ;
                             *ct != '\r' && *ct != '\n' && *ct != ';'
                                 && !is_space(*ct) ; ++ct) ;

                        /* note the character set name length */
                        cslen = ct - charset;

                        /* look no further */
                        break;
                    }
                }
            }

            /* if it's a text-mode file, create a character mapper */
            vm_obj_id_t csobj = VM_INVALID_OBJ;
            if (mode == VMOBJFILE_MODE_TEXT)
                csobj = CVmObjCharSet::create(vmg_ FALSE, charset, cslen);

            /* seek to the beginning of the reply stream */
            reply->seek(0, OSFSK_SET);

            /* create a File object from the Data Source */
            vm_obj_id_t fileobj = CVmObjFile::create(
                vmg_ FALSE, 0, csobj, reply, mode,
                VMOBJFILE_ACCESS_READ, TRUE);
            
            /* push the file object */
            G_interpreter->push_obj(vmg_ fileobj);

            /* 
             *   the File object owns the data source, which owns the reply
             *   stream, so forget about the reply stream
             */
            reply = 0;
        }
        else
        {
            /* no reply data - push nil */
            G_interpreter->push_nil(vmg0_);
        }

        /* push the network status code */
        G_interpreter->push_int(vmg_ status);

        /* push the caller's ID value */
        G_stk->push(&idg->val);

        /* relay our added argument count to the caller */
        *argc = 5;

        /* set the event type to NetEvReply (5 - see include/tadsnet.h) */
        *evt_type = 5;

        /* the event subclass is NetReplyEvent */
        return G_predef->net_reply_event;
    }